

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

const_iterator __thiscall
QHash<QNetworkRequest::Attribute,_QVariant>::constFindImpl<QNetworkRequest::Attribute>
          (QHash<QNetworkRequest::Attribute,_QVariant> *this,Attribute *key)

{
  Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *this_00;
  ulong uVar1;
  Data *pDVar2;
  Bucket BVar3;
  const_iterator cVar4;
  
  this_00 = this->d;
  if ((this_00 != (Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *)0x0) &&
     (this_00->size != 0)) {
    uVar1 = (this_00->seed >> 0x20 ^ (ulong)*key ^ this_00->seed) * -0x2917014799a6026d;
    uVar1 = (uVar1 >> 0x20 ^ uVar1) * -0x2917014799a6026d;
    BVar3 = QHashPrivate::Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_>::
            findBucketWithHash<QNetworkRequest::Attribute>(this_00,key,uVar1 >> 0x20 ^ uVar1);
    if ((BVar3.span)->offsets[BVar3.index] != 0xff) {
      pDVar2 = this->d;
      uVar1 = ((ulong)((long)BVar3.span - (long)pDVar2->spans) >> 4) * 0x1c71c71c71c71c80 |
              BVar3.index;
      goto LAB_0019eb50;
    }
  }
  uVar1 = 0;
  pDVar2 = (Data *)0x0;
LAB_0019eb50:
  cVar4.i.bucket = uVar1;
  cVar4.i.d = pDVar2;
  return (const_iterator)cVar4.i;
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return end();
        return const_iterator({d, it.toBucketIndex(d)});
    }